

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptObject.cpp
# Opt level: O0

Var Js::JavascriptObject::ToStringHelper(Var thisArg,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  int iVar4;
  undefined4 *puVar5;
  RecyclableObject *pRVar6;
  undefined4 extraout_var;
  ThreadContext *this;
  JavascriptString *pJVar7;
  Var thisArg_00;
  void *unaff_retaddr;
  undefined1 local_100 [8];
  EnterScriptObject __enterScriptObject;
  ScriptEntryExitRecord __entryExitRecord;
  ScriptContext *__localScriptContext;
  Var toStringValue;
  Type local_80;
  undefined1 local_78 [8];
  Arguments args;
  CallInfo info;
  Var values [1];
  Var result;
  DynamicObject *remoteObject;
  RecyclableObject *hostDispatchObject;
  TypeId type;
  ScriptContext *scriptContext_local;
  Var thisArg_local;
  TypeId local_18;
  TypeId typeId;
  
  if (thisArg == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  bVar2 = TaggedInt::Is(thisArg);
  if (bVar2) {
    local_18 = TypeIds_FirstNumberType;
  }
  else {
    bVar2 = JavascriptNumber::Is_NoTaggedIntCheck(thisArg);
    if (bVar2) {
      local_18 = TypeIds_Number;
    }
    else {
      pRVar6 = UnsafeVarTo<Js::RecyclableObject>(thisArg);
      if (pRVar6 == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      local_18 = RecyclableObject::GetTypeId(pRVar6);
      if ((0x57 < (int)local_18) && (BVar3 = RecyclableObject::IsExternal(pRVar6), BVar3 == 0)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
    }
  }
  if (local_18 == TypeIds_HostDispatch) {
    pRVar6 = VarTo<Js::RecyclableObject>(thisArg);
    iVar4 = (*(pRVar6->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x56])();
    if (CONCAT44(extraout_var,iVar4) == 0) {
      values[0] = (Var)0x0;
      CallInfo::CallInfo((CallInfo *)&args.Values,CallFlags_Value,1);
      local_80 = args.Values;
      Arguments::Arguments((Arguments *)local_78,(CallInfo)args.Values,(Var *)&info);
      info = (CallInfo)thisArg;
      Arguments::Arguments((Arguments *)&toStringValue,(Arguments *)local_78);
      iVar4 = (*(pRVar6->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x55])(pRVar6,EntryToString,&toStringValue,values);
      if (iVar4 != 0) {
        return values[0];
      }
    }
  }
  if ((0x2b < (int)local_18) && ((int)local_18 < 0x39)) {
    this = ScriptContext::GetThreadContext(scriptContext);
    bVar2 = ThreadContext::IsScriptActive(this);
    if (!bVar2) {
      __enterScriptObject.library = (JavascriptLibrary *)0x0;
      EnterScriptObject::EnterScriptObject
                ((EnterScriptObject *)local_100,scriptContext,
                 (ScriptEntryExitRecord *)&__enterScriptObject.library,unaff_retaddr,
                 &stack0x00000000,false,false,false);
      ScriptContext::OnScriptStart(scriptContext,false,true);
      EnterScriptObject::VerifyEnterScript((EnterScriptObject *)local_100);
      pJVar7 = ToStringTagHelper(thisArg,scriptContext,local_18);
      EnterScriptObject::~EnterScriptObject((EnterScriptObject *)local_100);
      return pJVar7;
    }
  }
  thisArg_00 = CrossSite::MarshalVar(scriptContext,thisArg,false);
  pJVar7 = ToStringTagHelper(thisArg_00,scriptContext,local_18);
  return pJVar7;
}

Assistant:

Var JavascriptObject::ToStringHelper(Var thisArg, ScriptContext* scriptContext)
{
    TypeId type = JavascriptOperators::GetTypeId(thisArg);

    // We first need to make sure we are in the right context.
    if (type == TypeIds_HostDispatch)
    {
        RecyclableObject* hostDispatchObject = VarTo<RecyclableObject>(thisArg);
        const DynamicObject* remoteObject = hostDispatchObject->GetRemoteObject();
        if (!remoteObject)
        {
            Var result = nullptr;
            Js::Var values[1];
            Js::CallInfo info(Js::CallFlags_Value, 1);
            Js::Arguments args(info, values);
            values[0] = thisArg;
            if (hostDispatchObject->InvokeBuiltInOperationRemotely(EntryToString, args, &result))
            {
                return result;
            }
        }
    }

    // Dispatch to @@toStringTag implementation.
    if (type >= TypeIds_TypedArrayMin && type <= TypeIds_TypedArrayMax && !scriptContext->GetThreadContext()->IsScriptActive())
    {
        // Use external call for typedarray in the debugger.
        Var toStringValue = nullptr;
        BEGIN_JS_RUNTIME_CALL_EX(scriptContext, false);
        toStringValue = ToStringTagHelper(thisArg, scriptContext, type);
        END_JS_RUNTIME_CALL(scriptContext);
        return toStringValue;
    }

    // By this point, we should be in the correct context, but the thisArg may still need to be marshalled (for to the implicit ToObject conversion call.)
    return ToStringTagHelper(CrossSite::MarshalVar(scriptContext, thisArg), scriptContext, type);
}